

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O2

Test * __thiscall
testing::internal::
TestFactoryImpl<google::protobuf::compiler::(anonymous_namespace)::CommandLineInterfaceTest_MultipleInputs_Test>
::CreateTest(TestFactoryImpl<google::protobuf::compiler::(anonymous_namespace)::CommandLineInterfaceTest_MultipleInputs_Test>
             *this)

{
  CommandLineInterfaceTest *this_00;
  
  this_00 = (CommandLineInterfaceTest *)operator_new(0x2e8);
  google::protobuf::compiler::anon_unknown_0::CommandLineInterfaceTest::CommandLineInterfaceTest
            (this_00);
  (this_00->super_CommandLineInterfaceTester).super_Test._vptr_Test =
       (_func_int **)&PTR__CommandLineInterfaceTester_01644a08;
  return (Test *)this_00;
}

Assistant:

Test* CreateTest() override { return new TestClass; }